

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::operator+(String *this,tagbstring *x)

{
  tagbstring *in_RDX;
  uchar *extraout_RDX;
  String SVar1;
  
  if (in_RDX->slen < 0) {
    operator+(this);
  }
  String(this,(String *)x);
  operator+=(this,in_RDX);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const tagbstring& x) const
    {
        if (x.slen < 0)    bstringThrow("Failure in + (tagbstring) operator, badly formed tagbstring");
        String retval(*this);
        retval += x;
        return retval;
    }